

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  long lVar1;
  sqlite3 *db;
  int *in_RSI;
  long in_RDI;
  int n;
  int *aLabel;
  Parse *pParse;
  Op *pOp;
  int nMaxArgs;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  byte *local_20;
  int local_14;
  
  local_14 = *in_RSI;
  lVar1 = *(long *)(in_RDI + 0x18);
  db = *(sqlite3 **)(lVar1 + 0x50);
  *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xffbf | 0x40;
  *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xff7f;
  local_20 = (byte *)(*(long *)(in_RDI + 0x88) + (long)(*(int *)(in_RDI + 0x90) + -1) * 0x18);
  do {
    if (*local_20 < 0x41) {
      switch(*local_20) {
      case 2:
        if (*(int *)(local_20 + 8) != 0) {
          *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xffbf;
        }
      case 0:
      case 1:
        *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xff7f | 0x80;
        break;
      case 3:
      case 4:
      case 5:
        *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xffbf;
        *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xff7f | 0x80;
        break;
      case 6:
        in_stack_ffffffffffffffcc = *(int *)(local_20 + -0x14);
        if (local_14 < in_stack_ffffffffffffffcc) {
          local_14 = in_stack_ffffffffffffffcc;
        }
      default:
        if (*(int *)(local_20 + 8) < 0) {
          *(undefined4 *)(local_20 + 8) =
               *(undefined4 *)
                ((long)&db->pVfs + (long)(int)(*(uint *)(local_20 + 8) ^ 0xffffffff) * 4);
        }
        break;
      case 7:
        if (local_14 < *(int *)(local_20 + 8)) {
          local_14 = *(int *)(local_20 + 8);
        }
        break;
      case 8:
        if (db != (sqlite3 *)0x0) {
          sqlite3DbNNFreeNN(db,(void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                           );
          *(undefined8 *)(lVar1 + 0x50) = 0;
        }
        *(undefined4 *)(lVar1 + 0x48) = 0;
        *in_RSI = local_14;
        return;
      }
    }
    local_20 = local_20 + -0x18;
  } while( true );
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;

  assert( pParse->db->mallocFailed==0 ); /* tag-20230419-1 */
  p->readOnly = 1;
  p->bIsReader = 0;
  pOp = &p->aOp[p->nOp-1];
  assert( p->aOp[0].opcode==OP_Init );
  while( 1 /* Loop terminates when it reaches the OP_Init opcode */ ){
    /* Only JUMP opcodes and the short list of special opcodes in the switch
    ** below need to be considered.  The mkopcodeh.tcl generator script groups
    ** all these opcodes together near the front of the opcode list.  Skip
    ** any opcode that does not need processing by virtual of the fact that
    ** it is larger than SQLITE_MX_JUMP_OPCODE, as a performance optimization.
    */
    if( pOp->opcode<=SQLITE_MX_JUMP_OPCODE ){
      /* NOTE: Be sure to update mkopcodeh.tcl when adding or removing
      ** cases from this switch! */
      switch( pOp->opcode ){
        case OP_Transaction: {
          if( pOp->p2!=0 ) p->readOnly = 0;
          /* no break */ deliberate_fall_through
        }
        case OP_AutoCommit:
        case OP_Savepoint: {
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_WAL
        case OP_Checkpoint:
#endif
        case OP_Vacuum:
        case OP_JournalMode: {
          p->readOnly = 0;
          p->bIsReader = 1;
          break;
        }
        case OP_Init: {
          assert( pOp->p2>=0 );
          goto resolve_p2_values_loop_exit;
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        case OP_VUpdate: {
          if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
          break;
        }
        case OP_VFilter: {
          int n;
          assert( (pOp - p->aOp) >= 3 );
          assert( pOp[-1].opcode==OP_Integer );
          n = pOp[-1].p1;
          if( n>nMaxArgs ) nMaxArgs = n;
          /* Fall through into the default case */
          /* no break */ deliberate_fall_through
        }
#endif
        default: {
          if( pOp->p2<0 ){
            /* The mkopcodeh.tcl script has so arranged things that the only
            ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
            ** have non-negative values for P2. */
            assert( (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)!=0 );
            assert( ADDR(pOp->p2)<-pParse->nLabel );
            assert( aLabel!=0 );  /* True because of tag-20230419-1 */
            pOp->p2 = aLabel[ADDR(pOp->p2)];
          }

          /* OPFLG_JUMP opcodes never have P2==0, though OPFLG_JUMP0 opcodes
          ** might */
          assert( pOp->p2>0
                  || (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP0)!=0 );

          /* Jumps never go off the end of the bytecode array */
          assert( pOp->p2<p->nOp
                  || (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)==0 );
          break;
        }
      }
      /* The mkopcodeh.tcl script has so arranged things that the only
      ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
      ** have non-negative values for P2. */
      assert( (sqlite3OpcodeProperty[pOp->opcode]&OPFLG_JUMP)==0 || pOp->p2>=0);
    }
    assert( pOp>p->aOp );
    pOp--;
  }
resolve_p2_values_loop_exit:
  if( aLabel ){
    sqlite3DbNNFreeNN(p->db, pParse->aLabel);
    pParse->aLabel = 0;
  }
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}